

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

int __thiscall ncnn::Crop::load_param(Crop *this,ParamDict *pd)

{
  Allocator *pAVar1;
  size_type sVar2;
  size_type sVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int *piVar7;
  undefined4 extraout_EDX;
  bool bVar8;
  undefined1 auVar9 [16];
  allocator<char> local_c9;
  undefined1 local_c8 [32];
  Allocator *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  int local_90;
  size_t local_88;
  undefined1 local_78 [32];
  Allocator *local_58;
  int iStack_50;
  int iStack_4c;
  int iStack_48;
  undefined8 uStack_44;
  size_t local_38;
  
  iVar4 = ParamDict::get(pd,0,0);
  this->woffset = iVar4;
  iVar4 = ParamDict::get(pd,1,0);
  this->hoffset = iVar4;
  iVar4 = ParamDict::get(pd,0xd,0);
  this->doffset = iVar4;
  iVar4 = ParamDict::get(pd,2,0);
  this->coffset = iVar4;
  iVar4 = ParamDict::get(pd,3,0);
  this->outw = iVar4;
  iVar4 = ParamDict::get(pd,4,0);
  this->outh = iVar4;
  iVar4 = ParamDict::get(pd,0xe,0);
  this->outd = iVar4;
  iVar4 = ParamDict::get(pd,5,0);
  this->outc = iVar4;
  iVar4 = ParamDict::get(pd,6,0);
  this->woffset2 = iVar4;
  iVar4 = ParamDict::get(pd,7,0);
  this->hoffset2 = iVar4;
  iVar4 = ParamDict::get(pd,0xf,0);
  this->doffset2 = iVar4;
  iVar4 = ParamDict::get(pd,8,0);
  this->coffset2 = iVar4;
  local_38 = 0;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_4_ = 0;
  local_78._20_8_ = 0;
  local_58 = (Allocator *)0x0;
  iStack_50 = 0;
  iStack_4c = 0;
  iStack_48 = 0;
  uStack_44._0_4_ = 0;
  uStack_44._4_4_ = 0;
  ParamDict::get((Mat *)local_c8,pd,9,(Mat *)local_78);
  piVar7 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (&this->starts != (Mat *)local_c8) {
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    piVar7 = (this->starts).refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        pAVar1 = (this->starts).allocator;
        if (pAVar1 == (Allocator *)0x0) {
          free((this->starts).data);
        }
        else {
          (*pAVar1->_vptr_Allocator[3])();
        }
      }
    }
    (this->starts).data = (void *)local_c8._0_8_;
    piVar7 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
    (this->starts).refcount = piVar7;
    (this->starts).elemsize = CONCAT44(local_c8._20_4_,local_c8._16_4_);
    (this->starts).elempack = local_c8._24_4_;
    (this->starts).allocator = local_a8;
    (this->starts).dims = (int)local_a0;
    (this->starts).w = local_a0._4_4_;
    (this->starts).h = (int)uStack_98;
    (this->starts).d = uStack_98._4_4_;
    (this->starts).c = local_90;
    (this->starts).cstep = local_88;
  }
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_a8 == (Allocator *)0x0) {
        free((void *)local_c8._0_8_);
      }
      else {
        (*local_a8->_vptr_Allocator[3])();
      }
    }
  }
  local_88 = 0;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_4_ = 0;
  local_c8._20_4_ = 0;
  local_c8._24_4_ = 0;
  local_90 = 0;
  local_a0._0_4_ = 0;
  local_a0._4_4_ = 0;
  uStack_98._0_4_ = 0;
  uStack_98._4_4_ = 0;
  piVar7 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_58 == (Allocator *)0x0) {
        free((void *)local_78._0_8_);
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  local_38 = 0;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_4_ = 0;
  local_78._20_8_ = 0;
  local_58 = (Allocator *)0x0;
  iStack_50 = 0;
  iStack_4c = 0;
  iStack_48 = 0;
  uStack_44._0_4_ = 0;
  uStack_44._4_4_ = 0;
  ParamDict::get((Mat *)local_c8,pd,10,(Mat *)local_78);
  piVar7 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (&this->ends != (Mat *)local_c8) {
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    piVar7 = (this->ends).refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        pAVar1 = (this->ends).allocator;
        if (pAVar1 == (Allocator *)0x0) {
          free((this->ends).data);
        }
        else {
          (*pAVar1->_vptr_Allocator[3])();
        }
      }
    }
    (this->ends).data = (void *)local_c8._0_8_;
    piVar7 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
    (this->ends).refcount = piVar7;
    (this->ends).elemsize = CONCAT44(local_c8._20_4_,local_c8._16_4_);
    (this->ends).elempack = local_c8._24_4_;
    (this->ends).allocator = local_a8;
    (this->ends).dims = (int)local_a0;
    (this->ends).w = local_a0._4_4_;
    (this->ends).h = (int)uStack_98;
    (this->ends).d = uStack_98._4_4_;
    (this->ends).c = local_90;
    (this->ends).cstep = local_88;
  }
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_a8 == (Allocator *)0x0) {
        free((void *)local_c8._0_8_);
      }
      else {
        (*local_a8->_vptr_Allocator[3])();
      }
    }
  }
  local_88 = 0;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_4_ = 0;
  local_c8._20_4_ = 0;
  local_c8._24_4_ = 0;
  local_90 = 0;
  local_a0._0_4_ = 0;
  local_a0._4_4_ = 0;
  uStack_98._0_4_ = 0;
  uStack_98._4_4_ = 0;
  piVar7 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_58 == (Allocator *)0x0) {
        free((void *)local_78._0_8_);
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  local_38 = 0;
  local_78._0_8_ = (pointer)0x0;
  local_78._8_4_ = 0;
  local_78._12_4_ = 0;
  local_78._16_4_ = 0;
  local_78._20_8_ = 0;
  local_58 = (Allocator *)0x0;
  iStack_50 = 0;
  iStack_4c = 0;
  iStack_48 = 0;
  uStack_44._0_4_ = 0;
  uStack_44._4_4_ = 0;
  ParamDict::get((Mat *)local_c8,pd,0xb,(Mat *)local_78);
  piVar7 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
  if (&this->axes != (Mat *)local_c8) {
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    piVar7 = (this->axes).refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        pAVar1 = (this->axes).allocator;
        if (pAVar1 == (Allocator *)0x0) {
          free((this->axes).data);
        }
        else {
          (*pAVar1->_vptr_Allocator[3])();
        }
      }
    }
    (this->axes).data = (void *)local_c8._0_8_;
    piVar7 = (int *)CONCAT44(local_c8._12_4_,local_c8._8_4_);
    (this->axes).refcount = piVar7;
    (this->axes).elemsize = CONCAT44(local_c8._20_4_,local_c8._16_4_);
    (this->axes).elempack = local_c8._24_4_;
    (this->axes).allocator = local_a8;
    (this->axes).dims = (int)local_a0;
    (this->axes).w = local_a0._4_4_;
    (this->axes).h = (int)uStack_98;
    (this->axes).d = uStack_98._4_4_;
    (this->axes).c = local_90;
    (this->axes).cstep = local_88;
  }
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_a8 == (Allocator *)0x0) {
        free((void *)local_c8._0_8_);
      }
      else {
        (*local_a8->_vptr_Allocator[3])();
      }
    }
  }
  local_88 = 0;
  local_c8._0_8_ = (pointer)0x0;
  local_c8._8_4_ = 0;
  local_c8._12_4_ = 0;
  local_c8._16_4_ = 0;
  local_c8._20_4_ = 0;
  local_c8._24_4_ = 0;
  local_90 = 0;
  local_a0._0_4_ = 0;
  local_a0._4_4_ = 0;
  uStack_98._0_4_ = 0;
  uStack_98._4_4_ = 0;
  piVar7 = (int *)CONCAT44(local_78._12_4_,local_78._8_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_58 == (Allocator *)0x0) {
        free((void *)local_78._0_8_);
      }
      else {
        (*local_58->_vptr_Allocator[3])();
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_c9);
  ParamDict::get((string *)local_c8,pd,0x13,(string *)local_78);
  std::__cxx11::string::operator=((string *)&this->starts_expr,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_c9);
  ParamDict::get((string *)local_c8,pd,0x14,(string *)local_78);
  std::__cxx11::string::operator=((string *)&this->ends_expr,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"",&local_c9);
  ParamDict::get((string *)local_c8,pd,0x15,(string *)local_78);
  std::__cxx11::string::operator=((string *)&this->axes_expr,(string *)local_c8);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::~string((string *)local_78);
  if ((this->starts).data == (void *)0x0) {
    bVar8 = false;
  }
  else {
    bVar8 = false;
    if (((long)(this->starts).c * (this->starts).cstep != 0) && ((this->ends).data != (void *)0x0))
    {
      bVar8 = (long)(this->ends).c * (this->ends).cstep != 0;
    }
  }
  sVar2 = (this->starts_expr)._M_string_length;
  auVar9._0_4_ = -(uint)(this->woffset2 == 0 && this->outw == 0);
  auVar9._4_4_ = -(uint)(this->hoffset2 == 0 && this->outh == 0);
  auVar9._8_4_ = -(uint)(this->doffset2 == 0 && this->outd == 0);
  auVar9._12_4_ = -(uint)(this->coffset2 == 0 && this->outc == 0);
  iVar4 = movmskps(extraout_EDX,auVar9);
  sVar3 = (this->ends_expr)._M_string_length;
  if ((iVar4 == 0xf) && (!(bool)((sVar3 != 0 && sVar2 != 0) | bVar8))) {
    (this->super_Layer).one_blob_only = false;
  }
  if (((sVar2 != 0) || (sVar3 != 0)) || ((this->axes_expr)._M_string_length != 0)) {
    iVar4 = count_expression_blobs(&this->starts_expr);
    iVar5 = count_expression_blobs(&this->ends_expr);
    iVar6 = count_expression_blobs(&this->axes_expr);
    if (((1 < iVar4) || (1 < iVar5)) || (1 < iVar6)) {
      (this->super_Layer).one_blob_only = false;
    }
  }
  return 0;
}

Assistant:

int Crop::load_param(const ParamDict& pd)
{
    woffset = pd.get(0, 0);
    hoffset = pd.get(1, 0);
    doffset = pd.get(13, 0);
    coffset = pd.get(2, 0);
    outw = pd.get(3, 0);
    outh = pd.get(4, 0);
    outd = pd.get(14, 0);
    outc = pd.get(5, 0);
    woffset2 = pd.get(6, 0);
    hoffset2 = pd.get(7, 0);
    doffset2 = pd.get(15, 0);
    coffset2 = pd.get(8, 0);

    starts = pd.get(9, Mat());
    ends = pd.get(10, Mat());
    axes = pd.get(11, Mat());

    starts_expr = pd.get(19, "");
    ends_expr = pd.get(20, "");
    axes_expr = pd.get(21, "");

    // NCNN_LOGE("%s %s %s", starts_expr.c_str(), ends_expr.c_str(), axes_expr.c_str());

    bool numpy_style_slice = !starts.empty() && !ends.empty();

    if (!starts_expr.empty() && !ends_expr.empty())
        numpy_style_slice = true;

    if (outw == 0 && outh == 0 && outd == 0 && outc == 0 && woffset2 == 0 && hoffset2 == 0 && doffset2 == 0 && coffset2 == 0 && !numpy_style_slice)
    {
        one_blob_only = false;
    }

    // count reference blobs
    if (!starts_expr.empty() || !ends_expr.empty() || !axes_expr.empty())
    {
        const int starts_blob_count = count_expression_blobs(starts_expr);
        const int ends_blob_count = count_expression_blobs(ends_expr);
        const int axes_blob_count = count_expression_blobs(axes_expr);

        // NCNN_LOGE("%d %d %d", starts_blob_count, ends_blob_count, axes_blob_count);
        if (starts_blob_count > 1 || ends_blob_count > 1 || axes_blob_count > 1)
            one_blob_only = false;
    }

    return 0;
}